

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::handleUnexpectedInflightException
          (RunContext *this,AssertionInfo *info,string *message,AssertionReaction *reaction)

{
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_t sVar4;
  size_type sVar5;
  undefined1 local_130 [8];
  AssertionResult assertionResult;
  LazyExpression local_90;
  undefined1 local_80 [8];
  AssertionResultData data;
  AssertionReaction *reaction_local;
  string *message_local;
  AssertionInfo *info_local;
  RunContext *this_local;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar1 = (info->macroName).m_start;
  sVar2 = (info->macroName).m_size;
  pcVar3 = (info->lineInfo).file;
  sVar4 = (info->lineInfo).line;
  sVar5 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar5;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar3;
  (this->m_lastAssertionInfo).lineInfo.line = sVar4;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar1;
  (this->m_lastAssertionInfo).macroName.m_size = sVar2;
  data._80_8_ = reaction;
  LazyExpression::LazyExpression(&local_90,false);
  AssertionResultData::AssertionResultData((AssertionResultData *)local_80,ThrewException,&local_90)
  ;
  std::__cxx11::string::operator=((string *)local_80,(string *)message);
  AssertionResult::AssertionResult
            ((AssertionResult *)local_130,info,(AssertionResultData *)local_80);
  assertionEnded(this,(AssertionResult *)local_130);
  populateReaction(this,(AssertionReaction *)data._80_8_);
  AssertionResult::~AssertionResult((AssertionResult *)local_130);
  AssertionResultData::~AssertionResultData((AssertionResultData *)local_80);
  return;
}

Assistant:

void RunContext::handleUnexpectedInflightException(
            AssertionInfo const& info,
            std::string const& message,
            AssertionReaction& reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( ResultWas::ThrewException, LazyExpression( false ) );
        data.message = message;
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );
        populateReaction( reaction );
    }